

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.c
# Opt level: O2

int mp_snprint_ext_default(char *buf,int size,char **data,int depth)

{
  int iVar1;
  ulong in_RAX;
  int8_t type;
  uint32_t len;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  mp_decode_ext(data,(int8_t *)((long)&uStack_28 + 3),(uint32_t *)((long)&uStack_28 + 4));
  iVar1 = snprintf(buf,(long)size,"(extension: type %d, len %u)",(ulong)(uint)(int)uStack_28._3_1_,
                   uStack_28 >> 0x20);
  return iVar1;
}

Assistant:

int
mp_snprint_ext_default(char *buf, int size, const char **data, int depth)
{
	(void) depth;
	int8_t type;
	uint32_t len;
	mp_decode_ext(data, &type, &len);
	return snprintf(buf, size, "(extension: type %d, len %u)", (int)type,
			(unsigned)len);
}